

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void ly_vlog(LY_ECODE code,LY_VLOG_ELEM elem_type,void *elem,...)

{
  uint16_t uVar1;
  LY_VECODE LVar2;
  char in_AL;
  LY_ERR *pLVar3;
  LY_VECODE *pLVar4;
  uint8_t *puVar5;
  char *in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *local_158;
  char *local_140;
  undefined1 local_108 [24];
  char *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  ushort *local_50;
  uint16_t *index;
  char *path;
  char *fmt;
  va_list ap;
  void *elem_local;
  LY_VLOG_ELEM elem_type_local;
  LY_ECODE code_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  index = (uint16_t *)0x0;
  local_50 = (ushort *)0x0;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  pLVar3 = ly_errno_location();
  *pLVar3 = LY_EVALID;
  if ((code != LYE_PATH) || (path_flag != 0)) {
    if (LYE_SUCCESS < code) {
      LVar2 = ecode2vecode[code];
      pLVar4 = ly_vecode_location();
      *pLVar4 = LVar2;
    }
    if (path_flag != 0) {
      pLVar3 = ly_errno_location();
      index = (uint16_t *)(pLVar3 + 0x106);
      pLVar3 = ly_errno_location();
      local_50 = (ushort *)((long)pLVar3 + 10);
      if ((elem_type == LY_VLOG_NONE) || (elem_type == LY_VLOG_PREV)) {
        if (elem_type == LY_VLOG_NONE) {
          *(undefined1 *)((long)index + (ulong)*local_50) = 0;
        }
      }
      else {
        *local_50 = 0x3ff;
        *(undefined1 *)((long)index + (ulong)*local_50) = 0;
        if (elem == (void *)0x0) {
          uVar1 = *local_50;
          *local_50 = uVar1 - 1;
          *(undefined1 *)((long)index + (ulong)(ushort)(uVar1 - 1)) = 0x2f;
        }
        else {
          ly_vlog_build_path_reverse(elem_type,elem,(char *)index,local_50,0);
        }
      }
    }
    ap[0].overflow_arg_area = local_108;
    ap[0]._0_8_ = &stack0x00000008;
    fmt._4_4_ = 0x30;
    fmt._0_4_ = 0x18;
    if (code == LYE_PATH) {
      puVar5 = ly_vlog_hide_location();
      log_vprintf(LY_LLERR,*puVar5,(char *)0x0,(char *)((long)index + (ulong)*local_50),
                  (__va_list_tag *)&fmt);
    }
    else if (code == LYE_SPEC) {
      fmt._4_4_ = 0x30;
      fmt._0_4_ = 0x20;
      path = local_f0;
      puVar5 = ly_vlog_hide_location();
      if ((local_50 == (ushort *)0x0) || (*(char *)((long)index + (ulong)*local_50) == '\0')) {
        local_140 = (char *)0x0;
      }
      else {
        local_140 = (char *)((long)index + (ulong)*local_50);
      }
      log_vprintf(LY_LLERR,*puVar5,path,local_140,(__va_list_tag *)&fmt);
    }
    else {
      puVar5 = ly_vlog_hide_location();
      if ((local_50 == (ushort *)0x0) || (*(char *)((long)index + (ulong)*local_50) == '\0')) {
        local_158 = (char *)0x0;
      }
      else {
        local_158 = (char *)((long)index + (ulong)*local_50);
      }
      log_vprintf(LY_LLERR,*puVar5,ly_errs[code],local_158,(__va_list_tag *)&fmt);
    }
  }
  return;
}

Assistant:

void
ly_vlog(LY_ECODE code, enum LY_VLOG_ELEM elem_type, const void *elem, ...)
{
    va_list ap;
    const char *fmt;
    char* path = NULL;
    uint16_t *index = NULL;

    ly_errno = LY_EVALID;

    if ((code == LYE_PATH) && !path_flag) {
        return;
    }
    if (code > 0) {
        ly_vecode = ecode2vecode[code];
    }

    if (!path_flag) {
        goto log;
    }

    /* resolve path */
    path = ((struct ly_err *)&ly_errno)->path;
    index = &((struct ly_err *)&ly_errno)->path_index;
    if ((elem_type != LY_VLOG_NONE) && (elem_type != LY_VLOG_PREV)) { /* != LY_VLOG_NONE */
        /* update path */
        (*index) = LY_BUF_SIZE - 1;
        path[(*index)] = '\0';
        if (!elem) {
            /* top-level */
            path[--(*index)] = '/';
        } else {
            ly_vlog_build_path_reverse(elem_type, elem, path, index, 0);
        }
    } else if (elem_type == LY_VLOG_NONE) {
        /* erase path, the rest will be erased by log_vprintf() since it will get NULL path parameter */
        path[(*index)] = '\0';
    }

log:
    va_start(ap, elem);
    switch (code) {
    case LYE_SPEC:
        fmt = va_arg(ap, char *);
        log_vprintf(LY_LLERR, (*ly_vlog_hide_location()), fmt, index && path[(*index)] ? &path[(*index)] : NULL, ap);
        break;
    case LYE_PATH:
        log_vprintf(LY_LLERR, (*ly_vlog_hide_location()), NULL, &path[(*index)], ap);
        break;
    default:
        log_vprintf(LY_LLERR, (*ly_vlog_hide_location()), ly_errs[code],
                    index && path[(*index)] ? &path[(*index)] : NULL, ap);
        break;
    }
    va_end(ap);
}